

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O0

spectral_operation __thiscall kitty::detail::spectrum::permutation(spectrum *this,uint i,uint j)

{
  spectral_operation sVar1;
  size_type sVar2;
  reference __a;
  reference __b;
  uint in_EDX;
  uint in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  uint k;
  spectral_operation op;
  uint local_1c;
  spectral_operation local_6;
  
  spectral_operation::spectral_operation(&local_6,permutation,(uint16_t)in_ESI,(uint16_t)in_EDX);
  local_1c = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
    if (sVar2 <= local_1c) break;
    if (((local_1c & in_ESI) != 0) && ((local_1c & in_EDX) == 0)) {
      __a = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(ulong)local_1c);
      __b = std::vector<int,_std::allocator<int>_>::operator[]
                      (in_RDI,(ulong)((local_1c - in_ESI) + in_EDX));
      std::swap<int>(__a,__b);
    }
    local_1c = local_1c + 1;
  }
  sVar1._var2 = local_6._var2;
  sVar1._kind = local_6._kind;
  sVar1._var1 = local_6._var1;
  return sVar1;
}

Assistant:

auto permutation( unsigned i, unsigned j )
  {
    spectral_operation op( spectral_operation::kind::permutation, i, j );

    for ( auto k = 0u; k < _s.size(); ++k )
    {
      if ( ( k & i ) > 0 && ( k & j ) == 0 )
      {
        std::swap( _s[k], _s[k - i + j] );
      }
    }

    return op;
  }